

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encapsulation.cpp
# Opt level: O0

void __thiscall
Encapsulation_reparentComponent_Test::~Encapsulation_reparentComponent_Test
          (Encapsulation_reparentComponent_Test *this)

{
  Encapsulation_reparentComponent_Test *this_local;
  
  ~Encapsulation_reparentComponent_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(Encapsulation, reparentComponent)
{
    const std::string e_parent_1 =
        "<?xml version=\"1.0\" encoding=\"UTF-8\"?>\n"
        "<model xmlns=\"http://www.cellml.org/cellml/2.0#\">\n"
        "  <component name=\"parent_component\"/>\n"
        "  <component name=\"child1\"/>\n"
        "  <component name=\"child2\"/>\n"
        "  <component name=\"child3\"/>\n"
        "  <encapsulation>\n"
        "    <component_ref component=\"parent_component\">\n"
        "      <component_ref component=\"child1\"/>\n"
        "      <component_ref component=\"child2\"/>\n"
        "      <component_ref component=\"child3\"/>\n"
        "    </component_ref>\n"
        "  </encapsulation>\n"
        "</model>\n";
    const std::string e_parent_2 =
        "<?xml version=\"1.0\" encoding=\"UTF-8\"?>\n"
        "<model xmlns=\"http://www.cellml.org/cellml/2.0#\">\n"
        "  <component name=\"parent_component\"/>\n"
        "  <component name=\"child1\"/>\n"
        "  <component name=\"child2\"/>\n"
        "  <component name=\"child3\"/>\n"
        "  <encapsulation>\n"
        "    <component_ref component=\"parent_component\">\n"
        "      <component_ref component=\"child1\"/>\n"
        "      <component_ref component=\"child2\">\n"
        "        <component_ref component=\"child3\"/>\n"
        "      </component_ref>\n"
        "    </component_ref>\n"
        "  </encapsulation>\n"
        "</model>\n";
    const std::string e_re_add =
        "<?xml version=\"1.0\" encoding=\"UTF-8\"?>\n"
        "<model xmlns=\"http://www.cellml.org/cellml/2.0#\">\n"
        "  <component name=\"parent_component\"/>\n"
        "  <component name=\"child1\"/>\n"
        "  <component name=\"child2\"/>\n"
        "  <component name=\"child3\"/>\n"
        "  <encapsulation>\n"
        "    <component_ref component=\"parent_component\">\n"
        "      <component_ref component=\"child1\"/>\n"
        "    </component_ref>\n"
        "    <component_ref component=\"child2\">\n"
        "      <component_ref component=\"child3\"/>\n"
        "    </component_ref>\n"
        "  </encapsulation>\n"
        "</model>\n";

    libcellml::ModelPtr model = libcellml::Model::create();
    libcellml::ComponentPtr parent = libcellml::Component::create();
    parent->setName("parent_component");
    libcellml::ComponentPtr child1 = libcellml::Component::create();
    child1->setName("child1");
    libcellml::ComponentPtr child2 = libcellml::Component::create();
    child2->setName("child2");
    libcellml::ComponentPtr child3 = libcellml::Component::create();
    child3->setName("child3");
    parent->addComponent(child1);
    parent->addComponent(child2);
    parent->addComponent(child3);

    model->addComponent(parent);

    libcellml::PrinterPtr printer = libcellml::Printer::create();
    std::string a_parent = printer->printModel(model);
    EXPECT_EQ(e_parent_1, a_parent);

    // 'child3's parent is changed to 'child2'.
    child2->addComponent(child3);

    a_parent = printer->printModel(model);
    EXPECT_EQ(e_parent_2, a_parent);

    // Now we have two components at the bottom of the hierarchy.
    model->addComponent(child2);
    a_parent = printer->printModel(model);
    EXPECT_EQ(e_re_add, a_parent);
}